

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall CodeGenGenericContext::InvalidateDependand(CodeGenGenericContext *this,x86Reg dreg)

{
  int iVar1;
  x86Reg xVar2;
  ArgType AVar3;
  long lVar4;
  MemCache *pMVar5;
  uint uVar6;
  ulong uVar7;
  
  for (lVar4 = 0; lVar4 != 0x220; lVar4 = lVar4 + 0x20) {
    iVar1 = *(int *)((long)&this->genReg[0].type + lVar4);
    if (iVar1 == 4) {
      if (*(x86Reg *)((long)&this->genReg[0].ptrBase + lVar4) != dreg) {
        xVar2 = *(x86Reg *)((long)&this->genReg[0].ptrIndex + lVar4);
        goto joined_r0x001c8e23;
      }
LAB_001c8e25:
      *(undefined4 *)((long)&this->genReg[0].type + lVar4) = 5;
    }
    else if (iVar1 == 2) {
      xVar2 = *(x86Reg *)((long)&this->genReg[0].field_1 + lVar4);
joined_r0x001c8e23:
      if (xVar2 == dreg) goto LAB_001c8e25;
    }
  }
  for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
    if ((*(int *)((long)&this->xmmReg[0].type + lVar4) == 4) &&
       ((*(x86Reg *)((long)&this->xmmReg[0].ptrBase + lVar4) == dreg ||
        (*(x86Reg *)((long)&this->genReg[0].ptrIndex + lVar4) == dreg)))) {
      *(undefined4 *)((long)&this->xmmReg[0].type + lVar4) = 5;
    }
  }
  pMVar5 = this->memCache;
  uVar6 = this->memCacheFreeSlotCount;
  lVar4 = 0;
  do {
    if (lVar4 == 0x10) {
      return;
    }
    AVar3 = (pMVar5->address).type;
    uVar7 = (ulong)uVar6;
    if (AVar3 == argPtr) {
      if (((pMVar5->address).ptrBase != dreg) && ((pMVar5->address).ptrIndex != dreg))
      goto LAB_001c8ec9;
      (pMVar5->address).type = argNone;
      (pMVar5->value).type = argNone;
      if (0xf < uVar6) {
        __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0xe9,"void CodeGenGenericContext::InvalidateDependand(x86Reg)");
      }
LAB_001c8eb7:
      uVar6 = uVar6 + 1;
      this->memCacheFreeSlotCount = uVar6;
      this->memCacheFreeSlots[uVar7] = (uint)lVar4;
    }
    else {
      if ((AVar3 == argReg) && ((pMVar5->address).field_1.reg == dreg)) {
        (pMVar5->address).type = argNone;
        (pMVar5->value).type = argNone;
        if (0xf < uVar6) {
          __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0xdf,"void CodeGenGenericContext::InvalidateDependand(x86Reg)");
        }
        goto LAB_001c8eb7;
      }
LAB_001c8ec9:
      AVar3 = (pMVar5->value).type;
      if (AVar3 == argPtr) {
        if ((pMVar5->value).ptrBase != dreg) {
          xVar2 = (pMVar5->value).ptrIndex;
          goto joined_r0x001c8ee8;
        }
LAB_001c8eea:
        (pMVar5->value).type = argNone;
      }
      else if (AVar3 == argReg) {
        xVar2 = (pMVar5->value).field_1.reg;
joined_r0x001c8ee8:
        if (xVar2 == dreg) goto LAB_001c8eea;
      }
    }
    lVar4 = lVar4 + 1;
    pMVar5 = pMVar5 + 1;
  } while( true );
}

Assistant:

void CodeGenGenericContext::InvalidateDependand(x86Reg dreg)
{
	for(unsigned i = 0; i < rRegCount; i++)
	{
		if(genReg[i].type == x86Argument::argReg && genReg[i].reg == dreg)
			genReg[i].type = x86Argument::argPtrLabel;

		if(genReg[i].type == x86Argument::argPtr && (genReg[i].ptrBase == dreg || genReg[i].ptrIndex == dreg))
			genReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		if(xmmReg[i].type == x86Argument::argPtr && (xmmReg[i].ptrBase == dreg || genReg[i].ptrIndex == dreg))
			xmmReg[i].type = x86Argument::argPtrLabel;
	}

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.address.type == x86Argument::argReg && entry.address.reg == dreg)
		{
			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = i;
			continue;
		}

		if(entry.address.type == x86Argument::argPtr && (entry.address.ptrBase == dreg || entry.address.ptrIndex == dreg))
		{
			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = i;
			continue;
		}

		if(entry.value.type == x86Argument::argReg && entry.value.reg == dreg)
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}

		if(entry.value.type == x86Argument::argPtr && (entry.value.ptrBase == dreg || entry.value.ptrIndex == dreg))
		{
			entry.value.type = x86Argument::argNone;
			continue;
		}
	}
}